

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_PkitsTest14DistributionPoints_::
Section14ValidonlyContainsCACertsCRLTest13<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
::TestBody(Section14ValidonlyContainsCACertsCRLTest13<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  PkitsTestInfo local_88;
  
  PkitsTestInfo::PkitsTestInfo(&local_88);
  local_88.test_number = "4.14.13";
  local_88.should_validate = true;
  PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::RunTest<3ul,2ul>
            ((PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate> *)
             &PTR_anon_var_dwarf_28892d_005a95a0,(char *(*) [3])&PTR_anon_var_dwarf_28895f_005a95c0,
             &local_88.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&local_88);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest14DistributionPoints,
                     Section14ValidonlyContainsCACertsCRLTest13) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "onlyContainsCACertsCACert",
                               "ValidonlyContainsCACertsTest13EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "onlyContainsCACertsCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.14.13";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}